

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounding_box.h
# Opt level: O2

void __thiscall draco::BoundingBox::Update(BoundingBox *this,Vector3f *new_point)

{
  float *pfVar1;
  int i;
  long lVar2;
  float fVar3;
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    fVar3 = (new_point->v_)._M_elems[lVar2];
    if (fVar3 < (this->min_point_).v_._M_elems[lVar2]) {
      (this->min_point_).v_._M_elems[lVar2] = fVar3;
      fVar3 = (new_point->v_)._M_elems[lVar2];
    }
    pfVar1 = (this->max_point_).v_._M_elems + lVar2;
    if (*pfVar1 <= fVar3 && fVar3 != *pfVar1) {
      (this->max_point_).v_._M_elems[lVar2] = fVar3;
    }
  }
  return;
}

Assistant:

void Update(const Vector3f &new_point) {
    for (int i = 0; i < 3; i++) {
      if (new_point[i] < min_point_[i]) {
        min_point_[i] = new_point[i];
      }
      if (new_point[i] > max_point_[i]) {
        max_point_[i] = new_point[i];
      }
    }
  }